

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  int iVar4;
  short sVar5;
  char cVar6;
  BYTE *s;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  short *psVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long *plVar20;
  char cVar21;
  ulong uVar22;
  short *psVar23;
  long lVar24;
  long *plVar25;
  BYTE *e;
  short *psVar26;
  long *plVar27;
  short *psVar28;
  long *plVar29;
  ulong *puVar30;
  char *pcVar31;
  int *piVar32;
  ulong *puVar33;
  LZ4_stream_t ctxBody;
  short *local_40c0;
  uint local_4050 [4096];
  uint local_50;
  undefined2 local_4a;
  uint local_38;
  
  iVar19 = 0;
  memset(local_4050,0,0x4020);
  local_50 = *srcSizePtr;
  uVar14 = (ulong)(int)local_50;
  if (uVar14 < 0x7e000001) {
    iVar19 = (uint)((ulong)local_50 * 0x8080808081 >> 0x27) + 0x10;
  }
  if (targetDstSize < iVar19) {
    psVar28 = (short *)(dst + targetDstSize);
    iVar19 = (int)src;
    plVar20 = (long *)src;
    psVar11 = (short *)dst;
    local_38 = local_50;
    if ((int)local_50 < 0x1000b) {
      if (0 < targetDstSize && local_50 < 0x7e000001) {
        local_4a = 3;
        if (0xc < local_50) {
          *(undefined2 *)((long)local_4050 + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2)
               = 0;
          puVar1 = (ulong *)(src + (uVar14 - 0xc));
          local_40c0 = (short *)dst;
LAB_00114c78:
          iVar18 = *(int *)((long)plVar20 + 1);
          uVar17 = 0x40;
          uVar22 = 1;
          plVar8 = (long *)((long)plVar20 + 1);
          do {
            plVar29 = plVar8;
            plVar8 = (long *)(uVar22 + (long)plVar29);
            psVar11 = local_40c0;
            if (src + (uVar14 - 0xb) < plVar8) goto LAB_0011512a;
            uVar22 = (ulong)(uVar17 >> 6);
            uVar17 = uVar17 + 1;
            uVar15 = (ulong)((uint)(iVar18 * -0x61c8864f) >> 0x13);
            uVar9 = (ulong)*(ushort *)((long)local_4050 + uVar15 * 2);
            sVar5 = (short)src;
            iVar18 = (int)*plVar8;
            *(short *)((long)local_4050 + uVar15 * 2) = (short)plVar29 - sVar5;
          } while (*(int *)(src + uVar9) != (int)*plVar29);
          iVar18 = (int)plVar29 - (int)plVar20;
          lVar7 = 0;
          cVar6 = (char)plVar29 * '\x10' + (char)plVar20 * -0x10;
          uVar17 = iVar18 - 0xfU;
          do {
            uVar13 = uVar17;
            cVar21 = cVar6;
            lVar24 = lVar7;
            pcVar31 = src + lVar24 + uVar9;
            plVar8 = (long *)(lVar24 + (long)plVar29);
            if ((pcVar31 <= src) || (plVar8 <= plVar20)) break;
            lVar7 = lVar24 + -1;
            cVar6 = cVar21 + -0x10;
            uVar17 = uVar13 - 1;
          } while (*(char *)((long)plVar29 + lVar24 + -1) == src[lVar24 + (uVar9 - 1)]);
          iVar16 = (int)lVar24;
          uVar22 = (ulong)(uint)(iVar16 + ((int)plVar29 - (int)plVar20));
          if ((short *)((long)local_40c0 + uVar22 + (ulong)(iVar18 + iVar16 + 0xf0) / 0xff + 0xc) <=
              psVar28) {
            plVar25 = (long *)((long)local_40c0 + 1);
            if ((uint)(iVar18 + iVar16) < 0xf) {
              *(char *)local_40c0 = cVar21;
            }
            else {
              uVar9 = (ulong)(iVar18 - 0xfU) + lVar24;
              *(char *)local_40c0 = -0x10;
              if (0xfe < (int)uVar9) {
                uVar17 = 0x1fd;
                if (uVar13 < 0x1fd) {
                  uVar17 = uVar13;
                }
                if (0x1fc < (int)uVar13) {
                  uVar13 = 0x1fd;
                }
                memset(plVar25,0xff,(ulong)((((iVar18 + 0xef) - uVar17) + iVar16) / 0xff + 1));
                uVar17 = ((iVar18 + 0xef) - uVar13) + iVar16;
                plVar25 = (long *)((long)local_40c0 + (ulong)uVar17 / 0xff + 2);
                uVar9 = (ulong)(iVar18 + -0x10e + iVar16 + uVar17 / 0xff);
              }
              *(char *)plVar25 = (char)uVar9;
              plVar25 = (long *)((long)plVar25 + 1);
            }
            plVar27 = (long *)(uVar22 + (long)plVar25);
            plVar10 = plVar20;
            do {
              *plVar25 = *plVar10;
              plVar25 = plVar25 + 1;
              plVar10 = plVar10 + 1;
            } while (plVar25 < plVar27);
            if ((short *)((long)plVar27 + 0xb) <= psVar28) {
              do {
                *(short *)plVar27 = (short)plVar8 - (short)pcVar31;
                puVar2 = (ulong *)((long)plVar8 + 4);
                puVar33 = (ulong *)(pcVar31 + 4);
                puVar30 = puVar2;
                if (puVar2 < puVar1) {
                  if (*puVar33 == *puVar2) {
                    puVar33 = (ulong *)(pcVar31 + 0xc);
                    puVar30 = (ulong *)((long)plVar8 + 0xc);
                    goto LAB_00114e99;
                  }
                  uVar9 = *puVar2 ^ *puVar33;
                  uVar22 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                }
                else {
LAB_00114e99:
                  if (puVar30 < puVar1) {
                    iVar18 = ((int)puVar30 - (int)plVar8) + -4;
LAB_00114ea9:
                    if (*puVar33 == *puVar30) goto code_r0x00114eb5;
                    uVar9 = *puVar30 ^ *puVar33;
                    uVar22 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    uVar22 = (ulong)(((uint)(uVar22 >> 3) & 0x1fffffff) + iVar18);
                    goto LAB_00114f2c;
                  }
LAB_00114ec5:
                  if ((puVar30 < src + (uVar14 - 8)) && ((int)*puVar33 == (int)*puVar30)) {
                    puVar30 = (ulong *)((long)puVar30 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar30 < src + (uVar14 - 6)) && ((short)*puVar33 == (short)*puVar30)) {
                    puVar30 = (ulong *)((long)puVar30 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar30 < src + (uVar14 - 5)) {
                    puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar33 == (char)*puVar30));
                  }
                  uVar22 = (ulong)(uint)((int)puVar30 - (int)puVar2);
                }
LAB_00114f2c:
                psVar11 = (short *)((long)plVar27 + 2);
                uVar13 = (uint)uVar22;
                plVar20 = (long *)((long)plVar8 + uVar22 + 4);
                uVar17 = uVar13;
                if (psVar28 < (short *)((long)plVar27 + (ulong)(uVar13 + 0xf0) / 0xff + 8)) {
                  uVar17 = ((int)psVar28 - (int)psVar11) * 0xff - 0x5ec;
                  plVar20 = (long *)((long)plVar20 - (ulong)(uVar13 - uVar17));
                  for (plVar8 = plVar20; plVar8 <= plVar29; plVar8 = (long *)((long)plVar8 + 1)) {
                    *(undefined2 *)
                     ((long)local_4050 + (ulong)((uint)((int)*plVar8 * -0x61c8864f) >> 0x13) * 2) =
                         0;
                  }
                }
                if (uVar17 < 0xf) {
                  *(char *)local_40c0 = (char)*local_40c0 + (char)uVar17;
                }
                else {
                  *(char *)local_40c0 = (char)*local_40c0 + '\x0f';
                  uVar13 = uVar17 - 0xf;
                  psVar11[0] = -1;
                  psVar11[1] = -1;
                  if (0x3fb < uVar13) {
                    uVar22 = (ulong)(((uVar17 - 0x40b) / 0x3fc) * 4);
                    memset((char *)((long)plVar27 + 6),0xff,uVar22 + 4);
                    uVar13 = (uVar17 - 0x40b) % 0x3fc;
                    psVar11 = (short *)((long)plVar27 + uVar22 + 6);
                  }
                  uVar17 = (uVar13 & 0xffff) / 0xff;
                  pcVar31 = (char *)((long)psVar11 + (ulong)uVar17);
                  psVar11 = (short *)(pcVar31 + 1);
                  *pcVar31 = (char)uVar17 + (char)uVar13;
                }
                if (src + (uVar14 - 0xb) <= plVar20) break;
                *(short *)((long)local_4050 +
                          (ulong)((uint)(*(int *)((long)plVar20 + -2) * -0x61c8864f) >> 0x13) * 2) =
                     ((short)plVar20 + -2) - sVar5;
                uVar22 = (ulong)((uint)((int)*plVar20 * -0x61c8864f) >> 0x13);
                uVar3 = *(ushort *)((long)local_4050 + uVar22 * 2);
                pcVar31 = src + uVar3;
                *(short *)((long)local_4050 + uVar22 * 2) = (short)plVar20 - sVar5;
                local_40c0 = psVar11;
                if (*(int *)(src + uVar3) != (int)*plVar20) goto LAB_00114c78;
                plVar27 = (long *)((long)psVar11 + 1);
                *(char *)psVar11 = '\0';
                plVar8 = plVar20;
                if (psVar28 < psVar11 + 6) break;
              } while( true );
            }
          }
        }
LAB_0011512a:
        pcVar31 = src + (uVar14 - (long)plVar20);
        if (psVar28 < (short *)((long)psVar11 + (long)(pcVar31 + (ulong)(pcVar31 + 0xf0) / 0xff + 1)
                               )) {
          pcVar31 = (char *)((long)psVar28 +
                            (~(ulong)psVar11 -
                            (ulong)((long)psVar28 + ~(ulong)psVar11 + 0xf0) / 0xff));
        }
        if (pcVar31 < (char *)0xf) {
          *(char *)psVar11 = (char)pcVar31 << 4;
        }
        else {
          pcVar12 = pcVar31 + -0xf;
          *(char *)psVar11 = -0x10;
          psVar28 = (short *)((long)psVar11 + 1);
          if ((char *)0xfe < pcVar12) {
            uVar14 = (ulong)(pcVar31 + -0x10e) / 0xff;
            memset(psVar28,0xff,uVar14 + 1);
            psVar28 = (short *)((long)psVar11 + uVar14 + 2);
            pcVar12 = pcVar31 + uVar14 * -0xff + -0x10e;
          }
          *(char *)psVar28 = (char)pcVar12;
          psVar11 = psVar28;
        }
        memcpy((char *)((long)psVar11 + 1),plVar20,(size_t)pcVar31);
        *srcSizePtr = ((int)plVar20 + (int)pcVar31) - iVar19;
        return ((int)(char *)((long)psVar11 + 1) + (int)pcVar31) - (int)dst;
      }
    }
    else if (0 < targetDstSize && local_50 < 0x7e000001) {
      plVar29 = (long *)(src + (uVar14 - 0xb));
      local_4a = 2;
      local_4050[(ulong)(*(long *)src * -0x30e4432345000000) >> 0x34] = 0;
      plVar8 = (long *)(src + 2);
      puVar1 = (ulong *)(src + (uVar14 - 0xc));
LAB_00114755:
      lVar7 = *(long *)((long)plVar20 + 1);
      uVar22 = 1;
      plVar25 = (long *)((long)plVar20 + 1);
      uVar17 = 0x41;
      while( true ) {
        plVar27 = plVar8;
        uVar9 = (ulong)(lVar7 * -0x30e4432345000000) >> 0x34;
        uVar13 = local_4050[uVar9];
        uVar15 = (ulong)uVar13;
        iVar18 = (int)plVar25;
        lVar7 = *plVar27;
        local_4050[uVar9] = iVar18 - iVar19;
        if (((uint)(iVar18 - iVar19) <= uVar13 + 0xffff) &&
           (*(int *)(src + uVar15) == (int)*plVar25)) break;
        plVar8 = (long *)(uVar22 + (long)plVar27);
        uVar22 = (ulong)(uVar17 >> 6);
        plVar25 = plVar27;
        uVar17 = uVar17 + 1;
        if (plVar29 < plVar8) goto LAB_0011512a;
      }
      iVar16 = iVar18 - (int)plVar20;
      lVar7 = 0;
      cVar6 = (char)plVar25 * '\x10' + (char)plVar20 * -0x10;
      uVar17 = iVar16 - 0xfU;
      do {
        uVar13 = uVar17;
        cVar21 = cVar6;
        lVar24 = lVar7;
        piVar32 = (int *)(src + lVar24 + uVar15);
        plVar8 = (long *)(lVar24 + (long)plVar25);
        if ((piVar32 <= src) || (plVar8 <= plVar20)) break;
        lVar7 = lVar24 + -1;
        cVar6 = cVar21 + -0x10;
        uVar17 = uVar13 - 1;
      } while (*(char *)((long)plVar25 + lVar24 + -1) == src[lVar24 + (uVar15 - 1)]);
      iVar4 = (int)lVar24;
      uVar22 = (ulong)(uint)((iVar18 - (int)plVar20) + iVar4);
      if ((short *)((long)psVar11 + uVar22 + (ulong)(iVar16 + iVar4 + 0xf0) / 0xff + 0xc) <= psVar28
         ) {
        pcVar31 = (char *)((long)psVar11 + 1);
        if ((uint)(iVar16 + iVar4) < 0xf) {
          *(char *)psVar11 = cVar21;
        }
        else {
          uVar9 = (ulong)(iVar16 - 0xfU) + lVar24;
          *(char *)psVar11 = -0x10;
          if (0xfe < (int)uVar9) {
            uVar17 = 0x1fd;
            if (uVar13 < 0x1fd) {
              uVar17 = uVar13;
            }
            if (0x1fc < (int)uVar13) {
              uVar13 = 0x1fd;
            }
            memset(pcVar31,0xff,(ulong)((((iVar16 + 0xef) - uVar17) + iVar4) / 0xff + 1));
            uVar17 = ((iVar16 + 0xef) - uVar13) + iVar4;
            pcVar31 = (char *)((long)psVar11 + (ulong)uVar17 / 0xff + 2);
            uVar9 = (ulong)(iVar16 + -0x10e + iVar4 + uVar17 / 0xff);
          }
          *pcVar31 = (char)uVar9;
          pcVar31 = pcVar31 + 1;
        }
        psVar26 = (short *)(pcVar31 + uVar22);
        lVar7 = 0;
        do {
          pcVar12 = pcVar31 + lVar7;
          *(undefined8 *)pcVar12 = *(undefined8 *)((long)plVar20 + lVar7);
          lVar7 = lVar7 + 8;
        } while (pcVar12 + 8 < psVar26);
        psVar23 = psVar11;
        if ((short *)((long)psVar26 + 0xb) <= psVar28) {
          do {
            *psVar26 = (short)plVar8 - (short)piVar32;
            puVar2 = (ulong *)((long)plVar8 + 4);
            puVar33 = (ulong *)(piVar32 + 1);
            puVar30 = puVar2;
            if (puVar2 < puVar1) {
              if (*puVar33 == *puVar2) {
                puVar33 = (ulong *)(piVar32 + 3);
                puVar30 = (ulong *)((long)plVar8 + 0xc);
                goto LAB_00114994;
              }
              uVar9 = *puVar2 ^ *puVar33;
              uVar22 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
            }
            else {
LAB_00114994:
              if (puVar30 < puVar1) {
                iVar18 = ((int)puVar30 - (int)plVar8) + -4;
LAB_001149a3:
                if (*puVar33 == *puVar30) goto code_r0x001149ae;
                uVar9 = *puVar30 ^ *puVar33;
                uVar22 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (ulong)(((uint)(uVar22 >> 3) & 0x1fffffff) + iVar18);
                goto LAB_00114a21;
              }
LAB_001149be:
              if ((puVar30 < src + (uVar14 - 8)) && ((int)*puVar33 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar30 < src + (uVar14 - 6)) && ((short)*puVar33 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar30 < src + (uVar14 - 5)) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar33 == (char)*puVar30));
              }
              uVar22 = (ulong)(uint)((int)puVar30 - (int)puVar2);
            }
LAB_00114a21:
            psVar11 = psVar26 + 1;
            uVar13 = (uint)uVar22;
            plVar20 = (long *)((long)plVar8 + uVar22 + 4);
            uVar17 = uVar13;
            if (psVar28 < (short *)((long)psVar26 + (ulong)(uVar13 + 0xf0) / 0xff + 8)) {
              uVar17 = ((int)psVar28 - (int)psVar11) * 0xff - 0x5ec;
              plVar20 = (long *)((long)plVar20 - (ulong)(uVar13 - uVar17));
              for (plVar8 = plVar20; plVar8 <= plVar25; plVar8 = (long *)((long)plVar8 + 1)) {
                local_4050[(ulong)(*plVar8 * -0x30e4432345000000) >> 0x34] = 0;
              }
            }
            if (uVar17 < 0xf) {
              *(char *)psVar23 = (char)*psVar23 + (char)uVar17;
            }
            else {
              *(char *)psVar23 = (char)*psVar23 + '\x0f';
              uVar13 = uVar17 - 0xf;
              psVar11[0] = -1;
              psVar11[1] = -1;
              if (0x3fb < uVar13) {
                uVar22 = (ulong)(((uVar17 - 0x40b) / 0x3fc) * 4);
                memset(psVar26 + 3,0xff,uVar22 + 4);
                uVar13 = (uVar17 - 0x40b) % 0x3fc;
                psVar11 = (short *)((long)psVar26 + uVar22 + 6);
              }
              uVar17 = (uVar13 & 0xffff) / 0xff;
              pcVar31 = (char *)((long)psVar11 + (ulong)uVar17);
              psVar11 = (short *)(pcVar31 + 1);
              *pcVar31 = (char)uVar17 + (char)uVar13;
            }
            if (plVar29 <= plVar20) break;
            local_4050[(ulong)(*(long *)((long)plVar20 + -2) * -0x30e4432345000000) >> 0x34] =
                 ((int)plVar20 + -2) - iVar19;
            uVar22 = (ulong)(*plVar20 * -0x30e4432345000000) >> 0x34;
            uVar13 = (int)plVar20 - iVar19;
            uVar17 = local_4050[uVar22];
            local_4050[uVar22] = uVar13;
            if ((uVar17 + 0xffff < uVar13) ||
               (piVar32 = (int *)(src + uVar17), *piVar32 != (int)*plVar20)) goto LAB_00114c13;
            psVar26 = (short *)((long)psVar11 + 1);
            *(char *)psVar11 = '\0';
            plVar8 = plVar20;
            psVar23 = psVar11;
            if (psVar28 < psVar11 + 6) break;
          } while( true );
        }
      }
      goto LAB_0011512a;
    }
    iVar19 = 0;
  }
  else {
    iVar19 = LZ4_compress_fast_extState(local_4050,src,dst,local_50,targetDstSize,1);
  }
  return iVar19;
code_r0x001149ae:
  puVar30 = puVar30 + 1;
  puVar33 = puVar33 + 1;
  iVar18 = iVar18 + 8;
  if (puVar1 <= puVar30) goto LAB_001149be;
  goto LAB_001149a3;
LAB_00114c13:
  plVar8 = (long *)((long)plVar20 + 2);
  if (plVar29 < plVar8) goto LAB_0011512a;
  goto LAB_00114755;
code_r0x00114eb5:
  puVar30 = puVar30 + 1;
  puVar33 = puVar33 + 1;
  iVar18 = iVar18 + 8;
  if (puVar1 <= puVar30) goto LAB_00114ec5;
  goto LAB_00114ea9;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}